

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSat.c
# Opt level: O0

int Res_SatSimulate(Res_Sim_t *p,int nPatsLimit,int fOnSet)

{
  int iVar1;
  int c;
  lit Entry;
  abctime aVar2;
  Abc_Obj_t *pAVar3;
  sat_solver *s;
  Vec_Int_t *p_00;
  uint *p_01;
  int *begin;
  int *piVar4;
  abctime aVar5;
  abctime clk;
  int iPat;
  int Var;
  int Lit;
  int status;
  int value;
  int k;
  int i;
  int RetValue;
  sat_solver *pSat;
  Vec_Ptr_t *vPats;
  Vec_Int_t *vLits;
  int fOnSet_local;
  int nPatsLimit_local;
  Res_Sim_t *p_local;
  
  k = -1;
  aVar2 = Abc_Clock();
  pAVar3 = Abc_NtkPo(p->pAig,1);
  toLitCond((pAVar3->field_6).iTemp,(uint)((fOnSet != 0 ^ 0xffU) & 1));
  if (fOnSet == 0) {
    clk._0_4_ = p->nPats0;
    pSat = (sat_solver *)p->vPats0;
  }
  else {
    clk._0_4_ = p->nPats1;
    pSat = (sat_solver *)p->vPats1;
  }
  if (nPatsLimit <= (int)clk) {
    __assert_fail("iPat < nPatsLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/res/resSat.c"
                  ,0xeb,"int Res_SatSimulate(Res_Sim_t *, int, int)");
  }
  s = (sat_solver *)Res_SatSimulateConstr(p->pAig,fOnSet);
  s->fSkipSimplify = 1;
  iVar1 = sat_solver_simplify(s);
  if (iVar1 == 0) {
    if ((int)clk == 0) {
      k = 0;
    }
  }
  else {
    k = 1;
    p_00 = Vec_IntAlloc(0x20);
    for (status = (int)clk; status < nPatsLimit; status = status + 1) {
      iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,10000,0,0,0);
      if (iVar1 == -1) {
        if (status == 0) {
          if (fOnSet == 0) {
            p->fConst1 = 1;
          }
          else {
            p->fConst0 = 1;
          }
          k = 0;
        }
        break;
      }
      if (iVar1 != 1) {
        k = (int)(status != 0);
        break;
      }
      Vec_IntClear(p_00);
      for (value = 0; value < p->nTruePis; value = value + 1) {
        pAVar3 = Abc_NtkPi(p->pAig,value);
        iVar1 = (pAVar3->field_6).iTemp;
        c = sat_solver_var_value(s,iVar1);
        if (c != 0) {
          p_01 = (uint *)Vec_PtrEntry((Vec_Ptr_t *)pSat,value);
          Abc_InfoSetBit(p_01,status);
        }
        Entry = toLitCond(iVar1,c);
        Vec_IntPush(p_00,Entry);
      }
      begin = Vec_IntArray(p_00);
      piVar4 = Vec_IntArray(p_00);
      iVar1 = Vec_IntSize(p_00);
      iVar1 = sat_solver_addclause(s,begin,piVar4 + iVar1);
      if (iVar1 == 0) {
        status = status + 1;
        k = 1;
        break;
      }
    }
    Vec_IntFree(p_00);
    if (fOnSet == 0) {
      p->nPats0 = status;
    }
    else {
      p->nPats1 = status;
    }
  }
  sat_solver_delete(s);
  aVar5 = Abc_Clock();
  p->timeSat = (aVar5 - aVar2) + p->timeSat;
  return k;
}

Assistant:

int Res_SatSimulate( Res_Sim_t * p, int nPatsLimit, int fOnSet )
{
    Vec_Int_t * vLits;
    Vec_Ptr_t * vPats;
    sat_solver * pSat;
    int RetValue = -1; // Suppress "might be used uninitialized"
    int i, k, value, status, Lit, Var, iPat;
    abctime clk = Abc_Clock();

//printf( "Looking for %s:  ", fOnSet? "onset " : "offset" );

    // decide what problem should be solved
    Lit = toLitCond( (int)(ABC_PTRUINT_T)Abc_NtkPo(p->pAig,1)->pCopy, !fOnSet );
    if ( fOnSet )
    {
        iPat = p->nPats1;
        vPats = p->vPats1;
    }
    else
    {
        iPat = p->nPats0;
        vPats = p->vPats0;
    }
    assert( iPat < nPatsLimit );

    // derive the SAT solver
    pSat = (sat_solver *)Res_SatSimulateConstr( p->pAig, fOnSet );
    pSat->fSkipSimplify = 1;
    status = sat_solver_simplify( pSat );
    if ( status == 0 )
    {
        if ( iPat == 0 )
        {
//            if ( fOnSet )
//                p->fConst0 = 1;
//            else
//                p->fConst1 = 1;
            RetValue = 0;
        }
        goto finish;
    }
 
    // enumerate through the SAT assignments
    RetValue = 1;
    vLits = Vec_IntAlloc( 32 );
    for ( k = iPat; k < nPatsLimit; k++ )
    {
        // solve with the assumption
//        status = sat_solver_solve( pSat, &Lit, &Lit + 1, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)10000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_False )
        {
//printf( "Const %d\n", !fOnSet );
            if ( k == 0 )
            {
                if ( fOnSet )
                    p->fConst0 = 1;
                else
                    p->fConst1 = 1;
                RetValue = 0;
            }
            break;
        }
        else if ( status == l_True )
        {
            // save the pattern
            Vec_IntClear( vLits );
            for ( i = 0; i < p->nTruePis; i++ )
            {
                Var = (int)(ABC_PTRUINT_T)Abc_NtkPi(p->pAig,i)->pCopy;
//                value = (int)(pSat->model.ptr[Var] == l_True);
                value = sat_solver_var_value(pSat, Var);
                if ( value )
                    Abc_InfoSetBit( (unsigned *)Vec_PtrEntry(vPats, i), k );
                Lit = toLitCond( Var, value );
                Vec_IntPush( vLits, Lit );
//                printf( "%d", value );
            }
//            printf( "\n" );

            status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            if ( status == 0 )
            {
                k++;
                RetValue = 1; 
                break;
            }
        }
        else
        {
//printf( "Undecided\n" );
            if ( k == 0 )
                RetValue = 0;
            else
                RetValue = 1; 
            break;
        }
    }
    Vec_IntFree( vLits );
//printf( "Found %d patterns\n", k - iPat );

    // set the new number of patterns
    if ( fOnSet )
        p->nPats1 = k;
    else
        p->nPats0 = k;

finish:

    sat_solver_delete( pSat );
p->timeSat += Abc_Clock() - clk;
    return RetValue;
}